

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

float Jf_CutCompareArea(Jf_Cut_t *pOld,Jf_Cut_t *pNew)

{
  Jf_Cut_t *pNew_local;
  Jf_Cut_t *pOld_local;
  
  if ((pOld->Flow != pNew->Flow) || (NAN(pOld->Flow) || NAN(pNew->Flow))) {
    pOld_local._4_4_ = pOld->Flow - pNew->Flow;
  }
  else if (pOld->pCut[0] == pNew->pCut[0]) {
    if (pOld->Time == pNew->Time) {
      pOld_local._4_4_ = 0.0;
    }
    else {
      pOld_local._4_4_ = (float)(pOld->Time - pNew->Time);
    }
  }
  else {
    pOld_local._4_4_ = (float)(pOld->pCut[0] - pNew->pCut[0]);
  }
  return pOld_local._4_4_;
}

Assistant:

float Jf_CutCompareArea( Jf_Cut_t * pOld, Jf_Cut_t * pNew )
{
//    float Epsilon = (float)0.001;
//    if ( pOld->Flow > pNew->Flow + Epsilon ) return 1;
//    if ( pOld->Flow < pNew->Flow - Epsilon ) return -1;
    if ( pOld->Flow    != pNew->Flow    ) return pOld->Flow    - pNew->Flow;
    if ( pOld->pCut[0] != pNew->pCut[0] ) return pOld->pCut[0] - pNew->pCut[0];
    if ( pOld->Time    != pNew->Time    ) return pOld->Time    - pNew->Time;
    return 0;
}